

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
* Vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
            (shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *args,
            shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *args_1,
            shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *args_2)

{
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *ret;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 *puVar1;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *this;
  size_type in_stack_ffffffffffffffb0;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::vector(in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::reserve(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
  ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
            (this,(shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)in_RDI);
  puVar1 = &local_10;
  std::
  vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
  ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
            (this,(shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)in_RDI);
  *puVar1 = 0;
  std::
  vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
  ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
            (this,(shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)in_RDI);
  local_c = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}